

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

PropertySpecSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PropertySpecSyntax,slang::syntax::TimingControlSyntax*&,slang::syntax::DisableIffSyntax*&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,TimingControlSyntax **args,DisableIffSyntax **args_1,
          PropertyExprSyntax *args_2)

{
  TimingControlSyntax *pTVar1;
  DisableIffSyntax *pDVar2;
  PropertySpecSyntax *pPVar3;
  
  pPVar3 = (PropertySpecSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PropertySpecSyntax *)this->endPtr < pPVar3 + 1) {
    pPVar3 = (PropertySpecSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pPVar3 + 1);
  }
  pTVar1 = *args;
  pDVar2 = *args_1;
  (pPVar3->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pPVar3->super_SyntaxNode).kind = PropertySpec;
  pPVar3->clocking = pTVar1;
  pPVar3->disable = pDVar2;
  (pPVar3->expr).ptr = args_2;
  if (pTVar1 != (TimingControlSyntax *)0x0) {
    (pTVar1->super_SyntaxNode).parent = &pPVar3->super_SyntaxNode;
  }
  if (pDVar2 != (DisableIffSyntax *)0x0) {
    (pDVar2->super_SyntaxNode).parent = &pPVar3->super_SyntaxNode;
  }
  (args_2->super_SyntaxNode).parent = &pPVar3->super_SyntaxNode;
  return pPVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }